

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_ecdsa_adaptor_sig_deserialize
              (secp256k1_ge *r,secp256k1_scalar *sigr,secp256k1_ge *rp,secp256k1_scalar *sp,
              secp256k1_scalar *dleq_proof_e,secp256k1_scalar *dleq_proof_s,uchar *adaptor_sig162)

{
  int iVar1;
  int local_44;
  secp256k1_scalar *psStack_40;
  int overflow;
  secp256k1_scalar *dleq_proof_s_local;
  secp256k1_scalar *dleq_proof_e_local;
  secp256k1_scalar *sp_local;
  secp256k1_ge *rp_local;
  secp256k1_scalar *sigr_local;
  secp256k1_ge *r_local;
  
  psStack_40 = dleq_proof_s;
  dleq_proof_s_local = dleq_proof_e;
  dleq_proof_e_local = sp;
  sp_local = (secp256k1_scalar *)rp;
  rp_local = (secp256k1_ge *)sigr;
  sigr_local = (secp256k1_scalar *)r;
  if ((r == (secp256k1_ge *)0x0) ||
     (iVar1 = secp256k1_eckey_pubkey_parse(r,adaptor_sig162,0x21), iVar1 != 0)) {
    if (rp_local != (secp256k1_ge *)0x0) {
      secp256k1_scalar_set_b32((secp256k1_scalar *)rp_local,adaptor_sig162 + 1,(int *)0x0);
      iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)rp_local);
      if (iVar1 != 0) {
        return 0;
      }
    }
    if ((sp_local == (secp256k1_scalar *)0x0) ||
       (iVar1 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)sp_local,adaptor_sig162 + 0x21,0x21),
       iVar1 != 0)) {
      if ((dleq_proof_e_local == (secp256k1_scalar *)0x0) ||
         (iVar1 = secp256k1_scalar_set_b32_seckey(dleq_proof_e_local,adaptor_sig162 + 0x42),
         iVar1 != 0)) {
        if (dleq_proof_s_local != (secp256k1_scalar *)0x0) {
          secp256k1_scalar_set_b32(dleq_proof_s_local,adaptor_sig162 + 0x62,(int *)0x0);
        }
        if ((psStack_40 == (secp256k1_scalar *)0x0) ||
           (secp256k1_scalar_set_b32(psStack_40,adaptor_sig162 + 0x82,&local_44), local_44 == 0)) {
          r_local._4_4_ = 1;
        }
        else {
          r_local._4_4_ = 0;
        }
      }
      else {
        r_local._4_4_ = 0;
      }
    }
    else {
      r_local._4_4_ = 0;
    }
  }
  else {
    r_local._4_4_ = 0;
  }
  return r_local._4_4_;
}

Assistant:

static int secp256k1_ecdsa_adaptor_sig_deserialize(secp256k1_ge *r, secp256k1_scalar *sigr, secp256k1_ge *rp, secp256k1_scalar *sp, secp256k1_scalar *dleq_proof_e, secp256k1_scalar *dleq_proof_s, const unsigned char *adaptor_sig162) {
    /* If r is deserialized, require that a sigr is provided to receive
     * the X-coordinate */
    VERIFY_CHECK((r == NULL) || (r != NULL && sigr != NULL));
    if (r != NULL) {
        if (!secp256k1_eckey_pubkey_parse(r, &adaptor_sig162[0], 33)) {
            return 0;
        }
    }
    if (sigr != NULL) {
        secp256k1_scalar_set_b32(sigr, &adaptor_sig162[1], NULL);
        if (secp256k1_scalar_is_zero(sigr)) {
            return 0;
        }
    }
    if (rp != NULL) {
        if (!secp256k1_eckey_pubkey_parse(rp, &adaptor_sig162[33], 33)) {
            return 0;
        }
    }
    if (sp != NULL) {
        if (!secp256k1_scalar_set_b32_seckey(sp, &adaptor_sig162[66])) {
            return 0;
        }
    }
    if (dleq_proof_e != NULL) {
        secp256k1_scalar_set_b32(dleq_proof_e, &adaptor_sig162[98], NULL);
    }
    if (dleq_proof_s != NULL) {
        int overflow;
        secp256k1_scalar_set_b32(dleq_proof_s, &adaptor_sig162[130], &overflow);
        if (overflow) {
            return 0;
        }
    }
    return 1;
}